

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhiteRoomTwoAction.cpp
# Opt level: O1

ActionResults * __thiscall WhiteRoomTwoAction::Rest(WhiteRoomTwoAction *this)

{
  itemLocation iVar1;
  ActionResults *this_00;
  ItemWrapper *this_01;
  _Alloc_hider _Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  itemType local_84;
  string local_80;
  string local_60;
  string local_40;
  
  if (this->roomLit == true) {
    this_00 = (ActionResults *)operator_new(0x30);
    paVar3 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "After sitting down, you begin to realize that this room reminds you of your last 80\'s disco party. "
               ,"");
    ActionResults::ActionResults(this_00,CURRENT,&local_40);
    _Var2._M_p = local_40._M_dataplus._M_p;
  }
  else {
    local_84 = POWER_CRYSTAL;
    this_01 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_84);
    iVar1 = ItemWrapper::getLocation(this_01);
    this_00 = (ActionResults *)operator_new(0x30);
    if (iVar1 == W_ROOM2) {
      paVar3 = &local_60.field_2;
      local_60._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,
                 "As you sit down, something pokes you in the rumpus. It feels like a crystal.","");
      ActionResults::ActionResults(this_00,CURRENT,&local_60);
      _Var2._M_p = local_60._M_dataplus._M_p;
    }
    else {
      paVar3 = &local_80.field_2;
      local_80._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,
                 "You and Bruce Wayne have something in common. You both like hanging out in the dark."
                 ,"");
      ActionResults::ActionResults(this_00,CURRENT,&local_80);
      _Var2._M_p = local_80._M_dataplus._M_p;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var2._M_p != paVar3) {
    operator_delete(_Var2._M_p);
  }
  return this_00;
}

Assistant:

ActionResults *WhiteRoomTwoAction::Rest() {
    if(roomLit){
        return new ActionResults(CURRENT, "After sitting down, you begin to realize that this room reminds you of your last 80's disco party. ");
    }
    else if(itemList->getValue(POWER_CRYSTAL)->getLocation() == W_ROOM2) {
        return new ActionResults(CURRENT, "As you sit down, something pokes you in the rumpus. It feels like a crystal.");
    }
    else {
        return new ActionResults(CURRENT, "You and Bruce Wayne have something in common. You both like hanging out in the dark.");
    }
}